

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryBuffer.cpp
# Opt level: O0

ErrorOr<std::unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>_>
* getMemoryBufferForStream
            (ErrorOr<std::unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>_>
             *__return_storage_ptr__,int FD,Twine *BufferName)

{
  int __v;
  ssize_t sVar1;
  size_t sVar2;
  int *piVar3;
  error_category *__cat;
  error_code EC;
  StringRef InputData;
  error_code local_4070;
  char *local_4060;
  int local_4054;
  long local_4050;
  ssize_t ReadBytes;
  SmallString<16384U> Buffer;
  ssize_t ChunkSize;
  Twine *BufferName_local;
  ErrorOr<std::unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>_>
  *pEStack_20;
  int FD_local;
  SmallVectorBase *local_18;
  SmallVectorBase *local_10;
  
  Buffer.super_SmallVector<char,_16384U>.super_SmallVectorStorage<char,_16384U>.InlineElts[0x3ff8].
  super_AlignedCharArray<1UL,_1UL>.buffer[0] = (AlignedCharArray<1UL,_1UL>)0x0;
  Buffer.super_SmallVector<char,_16384U>.super_SmallVectorStorage<char,_16384U>.InlineElts[0x3ff9].
  super_AlignedCharArray<1UL,_1UL>.buffer[0] = (AlignedCharArray<1UL,_1UL>)0x40;
  Buffer.super_SmallVector<char,_16384U>.super_SmallVectorStorage<char,_16384U>.InlineElts[0x3ffa].
  super_AlignedCharArray<1UL,_1UL>.buffer[0] = (AlignedCharArray<1UL,_1UL>)0x0;
  Buffer.super_SmallVector<char,_16384U>.super_SmallVectorStorage<char,_16384U>.InlineElts[0x3ffb].
  super_AlignedCharArray<1UL,_1UL>.buffer[0] = (AlignedCharArray<1UL,_1UL>)0x0;
  Buffer.super_SmallVector<char,_16384U>.super_SmallVectorStorage<char,_16384U>.InlineElts[0x3ffc].
  super_AlignedCharArray<1UL,_1UL>.buffer[0] = (AlignedCharArray<1UL,_1UL>)0x0;
  Buffer.super_SmallVector<char,_16384U>.super_SmallVectorStorage<char,_16384U>.InlineElts[0x3ffd].
  super_AlignedCharArray<1UL,_1UL>.buffer[0] = (AlignedCharArray<1UL,_1UL>)0x0;
  Buffer.super_SmallVector<char,_16384U>.super_SmallVectorStorage<char,_16384U>.InlineElts[0x3ffe].
  super_AlignedCharArray<1UL,_1UL>.buffer[0] = (AlignedCharArray<1UL,_1UL>)0x0;
  Buffer.super_SmallVector<char,_16384U>.super_SmallVectorStorage<char,_16384U>.InlineElts[0x3fff].
  super_AlignedCharArray<1UL,_1UL>.buffer[0] = (AlignedCharArray<1UL,_1UL>)0x0;
  BufferName_local._4_4_ = FD;
  pEStack_20 = __return_storage_ptr__;
  llvm::SmallString<16384U>::SmallString((SmallString<16384U> *)&ReadBytes);
  do {
    sVar2 = llvm::SmallVectorBase::size((SmallVectorBase *)&ReadBytes);
    llvm::SmallVectorImpl<char>::reserve((SmallVectorImpl<char> *)&ReadBytes,sVar2 + 0x4000);
    sVar1 = ReadBytes;
    local_4054 = -1;
    local_18 = (SmallVectorBase *)&ReadBytes;
    local_10 = local_18;
    sVar2 = llvm::SmallVectorBase::size(local_18);
    local_4060 = (char *)(sVar1 + sVar2);
    local_4050 = llvm::sys::RetryAfterSignal<int,long(int,void*,unsigned_long),int,char*,long>
                           (&local_4054,read,(int *)((long)&BufferName_local + 4),&local_4060,
                            (long *)(Buffer.super_SmallVector<char,_16384U>.
                                     super_SmallVectorStorage<char,_16384U>.InlineElts + 0x3ff8));
    if (local_4050 == -1) {
      piVar3 = __errno_location();
      __v = *piVar3;
      __cat = (error_category *)std::_V2::generic_category();
      std::error_code::error_code(&local_4070,__v,__cat);
      EC._4_4_ = 0;
      EC._M_value = local_4070._M_value;
      EC._M_cat = local_4070._M_cat;
      llvm::
      ErrorOr<std::unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>_>
      ::ErrorOr(__return_storage_ptr__,EC);
      goto LAB_00235fc2;
    }
    sVar2 = llvm::SmallVectorBase::size((SmallVectorBase *)&ReadBytes);
    llvm::SmallVectorBase::set_size((SmallVectorBase *)&ReadBytes,sVar2 + local_4050);
  } while (local_4050 != 0);
  InputData = llvm::SmallString::operator_cast_to_StringRef((SmallString *)&ReadBytes);
  getMemBufferCopyImpl(__return_storage_ptr__,InputData,BufferName);
LAB_00235fc2:
  llvm::SmallString<16384U>::~SmallString((SmallString<16384U> *)&ReadBytes);
  return __return_storage_ptr__;
}

Assistant:

static ErrorOr<std::unique_ptr<WritableMemoryBuffer>>
getMemoryBufferForStream(int FD, const Twine &BufferName) {
  const ssize_t ChunkSize = 4096*4;
  SmallString<ChunkSize> Buffer;
  ssize_t ReadBytes;
  // Read into Buffer until we hit EOF.
  do {
    Buffer.reserve(Buffer.size() + ChunkSize);
    ReadBytes = sys::RetryAfterSignal(-1, ::read, FD, Buffer.end(), ChunkSize);
    if (ReadBytes == -1)
      return std::error_code(errno, std::generic_category());
    Buffer.set_size(Buffer.size() + ReadBytes);
  } while (ReadBytes != 0);

  return getMemBufferCopyImpl(Buffer, BufferName);
}